

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLExportTest_createTest_Test::~OpenDDLExportTest_createTest_Test
          (OpenDDLExportTest_createTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, createTest) {
    bool ok(true);
    try {
        OpenDDLExport myExport;
    } catch (...) {
        ok = false;
    }
    EXPECT_TRUE(ok);
}